

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

void cf_hc_close(Curl_cfilter *cf,Curl_easy *data)

{
  curl_trc_feat *pcVar1;
  Curl_cfilter *pCVar2;
  
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
    pcVar1 = (data->state).feat;
    if (pcVar1 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) goto LAB_00114f80;
    }
    else if ((cf == (Curl_cfilter *)0x0) || (pcVar1->log_level < 1)) goto LAB_00114f80;
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"close");
    }
  }
LAB_00114f80:
  cf_hc_reset((Curl_cfilter *)cf->ctx,data);
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  pCVar2 = cf->next;
  if (pCVar2 == (Curl_cfilter *)0x0) {
    return;
  }
  (*(code *)pCVar2->cft->do_close)(pCVar2,data);
  Curl_conn_cf_discard_chain(&cf->next,data);
  return;
}

Assistant:

static void cf_hc_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  CURL_TRC_CF(data, cf, "close");
  cf_hc_reset(cf, data);
  cf->connected = FALSE;

  if(cf->next) {
    cf->next->cft->do_close(cf->next, data);
    Curl_conn_cf_discard_chain(&cf->next, data);
  }
}